

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O3

void __thiscall OpenMD::LJ::calcForce(LJ *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer piVar5;
  uint i;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  double local_48 [4];
  double local_28 [3];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar5 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar5[idat->atid1]].
                    super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar7 = (long)piVar5[idat->atid2] * 0x20;
  dVar1 = *(double *)(lVar6 + 8 + lVar7);
  dVar2 = *(double *)(lVar6 + 0x10 + lVar7);
  dVar3 = idat->rij;
  dVar10 = 1.0 / (dVar2 * dVar3);
  dVar8 = dVar10 * dVar10;
  dVar8 = dVar8 * dVar8 * dVar8;
  dVar11 = dVar10 * dVar8 * dVar8;
  if (idat->shiftedPot == true) {
    dVar9 = 1.0 / (idat->rcut * dVar2);
    dVar9 = dVar9 * dVar9;
    dVar9 = dVar9 * dVar9 * dVar9;
    dVar13 = (dVar9 * dVar9 - dVar9) * 4.0;
    dVar9 = 0.0;
  }
  else {
    dVar13 = 0.0;
    dVar9 = 0.0;
    if (idat->shiftedForce == true) {
      dVar9 = 1.0 / (dVar2 * idat->rcut);
      dVar12 = dVar9 * dVar9;
      dVar12 = dVar12 * dVar12 * dVar12;
      dVar13 = dVar9 * dVar12 * dVar12;
      dVar9 = (dVar9 * dVar12 - (dVar13 + dVar13)) * 24.0;
      dVar13 = (dVar3 - idat->rcut) * dVar9 * dVar2 + (dVar12 * dVar12 - dVar12) * 4.0;
    }
  }
  dVar12 = idat->sw;
  dVar4 = idat->vdwMult;
  dVar14 = dVar1 * dVar4 * ((dVar8 * dVar8 - dVar8) * 4.0 - dVar13);
  dVar13 = dVar12 * dVar14;
  idat->vpair = dVar14 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar13;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar13 + (idat->selePot).data_[1];
  }
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  lVar6 = 0;
  do {
    local_48[lVar6] =
         (idat->d).super_Vector<double,_3U>.data_[lVar6] *
         dVar2 * ((dVar10 * dVar8 - (dVar11 + dVar11)) * 24.0 - dVar9) * dVar1 * dVar4 * dVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar6 = 0;
  do {
    local_28[lVar6] = local_48[lVar6] / dVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar6] =
         local_28[lVar6] + (idat->f1).super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void LJ::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    LJInteractionData& mixer =
        MixingMap[LJtids[idat.atid1]][LJtids[idat.atid2]];

    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getLJfunc(ros, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getLJfunc(rcos, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }